

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * X509_dup(X509 *x509)

{
  X509 *pXVar1;
  X509 *ret;
  uint8_t *inp;
  X509 *pXStack_20;
  int len;
  uint8_t *der;
  X509 *x509_local;
  
  pXStack_20 = (X509 *)0x0;
  der = (uint8_t *)x509;
  inp._4_4_ = i2d_X509((X509 *)x509,(uint8_t **)&stack0xffffffffffffffe0);
  if (inp._4_4_ < 0) {
    x509_local = (X509 *)0x0;
  }
  else {
    ret = pXStack_20;
    pXVar1 = d2i_X509((X509 **)0x0,(uchar **)&ret,(long)inp._4_4_);
    OPENSSL_free(pXStack_20);
    x509_local = (X509 *)pXVar1;
  }
  return (X509 *)x509_local;
}

Assistant:

X509 *X509_dup(X509 *x509) {
  uint8_t *der = NULL;
  int len = i2d_X509(x509, &der);
  if (len < 0) {
    return NULL;
  }

  const uint8_t *inp = der;
  X509 *ret = d2i_X509(NULL, &inp, len);
  OPENSSL_free(der);
  return ret;
}